

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_api.cpp
# Opt level: O0

const_buffer * __thiscall
cppcms::impl::cgi::http::make_chunked_wrapper(http *this,const_buffer *in,bool completed)

{
  size_t sVar1;
  buffer_impl<const_char_*> *this_00;
  string *d;
  ostream *poVar2;
  byte in_CL;
  long in_RSI;
  const_buffer *in_RDI;
  int trailer_len;
  char *trailer;
  ostringstream ss;
  const_buffer *in_stack_fffffffffffffd58;
  const_buffer *in_stack_fffffffffffffd60;
  buffer_impl<const_char_*> *in_stack_fffffffffffffd78;
  const_buffer *b1;
  string local_1c8 [48];
  ostringstream local_198 [383];
  byte local_19;
  
  local_19 = in_CL & 1;
  b1 = in_RDI;
  sVar1 = booster::aio::buffer_impl<const_char_*>::bytes_count(in_stack_fffffffffffffd78);
  if (sVar1 == 0) {
    if ((local_19 & 1) == 0) {
      booster::aio::const_buffer::const_buffer(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
    }
    else {
      booster::aio::buffer(b1,(size_t)in_RDI);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_198);
    this_00 = (buffer_impl<const_char_*> *)std::ostream::operator<<(local_198,std::hex);
    d = (string *)booster::aio::buffer_impl<const_char_*>::bytes_count(this_00);
    poVar2 = (ostream *)std::ostream::operator<<(this_00,(ulong)d);
    std::operator<<(poVar2,"\r\n");
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=((string *)(in_RSI + 0x280),local_1c8);
    std::__cxx11::string::~string(local_1c8);
    booster::aio::buffer(d);
    booster::aio::operator+(b1,in_RDI);
    booster::aio::buffer(b1,(size_t)in_RDI);
    booster::aio::operator+(b1,in_RDI);
    booster::aio::const_buffer::~const_buffer((const_buffer *)0x49ca13);
    booster::aio::const_buffer::~const_buffer((const_buffer *)0x49ca20);
    booster::aio::const_buffer::~const_buffer((const_buffer *)0x49ca2a);
    std::__cxx11::ostringstream::~ostringstream(local_198);
  }
  return b1;
}

Assistant:

booster::aio::const_buffer make_chunked_wrapper(booster::aio::const_buffer const &in,bool completed)
		{
			if(in.bytes_count() == 0) {
				if(!completed) 
					return in;
				else 
					return booster::aio::buffer("0\r\n\r\n",5);
			}

			std::ostringstream ss;
			ss << std::hex << in.bytes_count() << "\r\n";
			chunked_header_ = std::move(ss.str());
			char const *trailer = "\r\n";
			int trailer_len = 2;
			if(completed) {
				trailer = "\r\n0\r\n\r\n";
				trailer_len = 7;
			}
			return booster::aio::buffer(chunked_header_) + in + booster::aio::buffer(trailer,trailer_len);
		}